

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O2

void signature_destroy(signature s)

{
  set *ppsVar1;
  ulong uVar2;
  
  if (s != (signature)0x0) {
    ppsVar1 = &s[1].map;
    for (uVar2 = 0; uVar2 < s->count; uVar2 = uVar2 + 1) {
      free(*ppsVar1);
      ppsVar1 = ppsVar1 + 3;
    }
    set_destroy(s->map);
    free(s);
    return;
  }
  return;
}

Assistant:

void signature_destroy(signature s)
{
	if (s != NULL)
	{
		size_t index;

		for (index = 0; index < s->count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(s->map);

		free(s);
	}
}